

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O0

uint64_t protobuf_test_messages_proto2_TestAllTypesProto2_optional_fixed64
                   (protobuf_test_messages_proto2_TestAllTypesProto2 *msg)

{
  protobuf_test_messages_proto2_TestAllTypesProto2 *to;
  upb_MiniTableField *f;
  bool bVar1;
  void *from;
  uint64_t uVar2;
  undefined1 local_4c [8];
  upb_MiniTableField field;
  uint64_t ret;
  uint64_t default_val;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_local;
  uint64_t *local_20;
  upb_MiniTableField *local_18;
  protobuf_test_messages_proto2_TestAllTypesProto2 *local_10;
  uint64_t uVar3;
  
  ret = 0;
  local_4c._0_4_ = 8;
  local_4c._4_2_ = 0x120;
  local_4c._6_2_ = 0x47;
  field.number_dont_copy_me__upb_internal_use_only = 0xc206ffff;
  local_18 = (upb_MiniTableField *)local_4c;
  local_20 = &ret;
  msg_local = (protobuf_test_messages_proto2_TestAllTypesProto2 *)
              &field.offset_dont_copy_me__upb_internal_use_only;
  default_val = (uint64_t)msg;
  local_10 = msg;
  bVar1 = upb_MiniTableField_IsExtension(local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  bVar1 = upb_MiniTableField_IsInOneof(local_18);
  if (((bVar1) ||
      (bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(local_18,local_20)
      , !bVar1)) &&
     (bVar1 = upb_Message_HasBaseField(&local_10->base_dont_copy_me__upb_internal_use_only,local_18)
     , !bVar1)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(local_18,msg_local,local_20);
    uVar3._0_2_ = field.offset_dont_copy_me__upb_internal_use_only;
    uVar3._2_2_ = field.presence;
    uVar3._4_2_ = field.submsg_index_dont_copy_me__upb_internal_use_only;
    uVar3._6_1_ = field.descriptortype_dont_copy_me__upb_internal_use_only;
    uVar3._7_1_ = field.mode_dont_copy_me__upb_internal_use_only;
    return uVar3;
  }
  f = local_18;
  to = msg_local;
  from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                   (&local_10->base_dont_copy_me__upb_internal_use_only,local_18);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,to,from);
  uVar2._0_2_ = field.offset_dont_copy_me__upb_internal_use_only;
  uVar2._2_2_ = field.presence;
  uVar2._4_2_ = field.submsg_index_dont_copy_me__upb_internal_use_only;
  uVar2._6_1_ = field.descriptortype_dont_copy_me__upb_internal_use_only;
  uVar2._7_1_ = field.mode_dont_copy_me__upb_internal_use_only;
  return uVar2;
}

Assistant:

UPB_INLINE uint64_t protobuf_test_messages_proto2_TestAllTypesProto2_optional_fixed64(const protobuf_test_messages_proto2_TestAllTypesProto2* msg) {
  uint64_t default_val = (uint64_t)0ull;
  uint64_t ret;
  const upb_MiniTableField field = {8, UPB_SIZE(528, 288), 71, kUpb_NoSub, 6, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_8Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}